

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::PortalImageInfiniteLight::PDF_Le
          (PortalImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  ulong uVar2;
  Float FVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Float duv_dw;
  Point2f st;
  Bounds2f b;
  float local_4c;
  Tuple2<pbrt::Point2,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_40;
  Bounds2f local_30;
  undefined1 extraout_var [56];
  
  uVar2._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_4_ = (float)(undefined4)uVar2 * (float)(undefined4)uVar2;
  auVar8._4_4_ = (float)uVar2._4_4_ * (float)uVar2._4_4_;
  auVar8._8_8_ = 0;
  auVar8 = vmovshdup_avx(auVar8);
  auVar8 = vfmadd231ss_fma(auVar8,auVar6,auVar6);
  auVar7._0_8_ = uVar2 ^ 0x8000000080000000;
  auVar7._8_4_ = 0x80000000;
  auVar7._12_4_ = 0x80000000;
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  local_40.z = auVar8._0_4_;
  auVar9._4_4_ = local_40.z;
  auVar9._0_4_ = local_40.z;
  auVar9._8_4_ = local_40.z;
  auVar9._12_4_ = local_40.z;
  local_40.z = -fVar1 / local_40.z;
  auVar8 = vdivps_avx(auVar7,auVar9);
  local_40._0_8_ = vmovlps_avx(auVar8);
  auVar5._0_8_ = ImageFromRender(this,(Vector3f *)&local_40,&local_4c);
  auVar5._8_56_ = extraout_var;
  local_48 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar5._0_16_);
  if ((local_4c != 0.0) || (NAN(local_4c))) {
    auVar4._8_4_ = 0x3f800000;
    auVar4._0_8_ = 0x3f8000003f800000;
    auVar4._12_4_ = 0x3f800000;
    local_30 = (Bounds2f)vmovlhps_avx(ZEXT416(0) << 0x40,auVar4);
    FVar3 = WindowedPiecewiseConstant2D::PDF(&this->distribution,(Point2f *)&local_48,&local_30);
    *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
    *pdfDir = FVar3 / local_4c;
  }
  else {
    *pdfDir = 0.0;
    *pdfPos = 0.0;
  }
  return;
}

Assistant:

void PortalImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos,
                                      Float *pdfDir) const {
    // TODO: negate here or???
    Vector3f w = -Normalize(ray.d);
    Float duv_dw;
    Point2f st = ImageFromRender(w, &duv_dw);

    if (duv_dw == 0) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Float pdf = distribution.PDF(st, b);

#if 0
    Normal3f n = Normal3f(portalFrame.z);
    *pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    *pdfDir = pdf / duv_dw;
}